

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool setFontStyleFromValue(Value *value,QFont *font)

{
  int iVar1;
  undefined8 in_RSI;
  QFont *in_RDI;
  Style style;
  bool local_1;
  
  if (*(int *)&(in_RDI->d).d.ptr == 6) {
    iVar1 = QVariant::toInt((bool *)&in_RDI->resolve_mask);
    style = (Style)((ulong)in_RSI >> 0x20);
    if (iVar1 == 1) {
      QFont::setStyle(in_RDI,style);
      local_1 = true;
    }
    else if (iVar1 == 0xb) {
      QFont::setStyle(in_RDI,style);
      local_1 = true;
    }
    else if (iVar1 == 0xc) {
      QFont::setStyle(in_RDI,style);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool setFontStyleFromValue(const QCss::Value &value, QFont *font)
{
    if (value.type != Value::KnownIdentifier)
        return false ;
    switch (value.variant.toInt()) {
        case Value_Normal: font->setStyle(QFont::StyleNormal); return true;
        case Value_Italic: font->setStyle(QFont::StyleItalic); return true;
        case Value_Oblique: font->setStyle(QFont::StyleOblique); return true;
        default: break;
    }
    return false;
}